

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CopyMessageTest_ArenaEnabledCopyConstructor_Test::
CopyMessageTest_ArenaEnabledCopyConstructor_Test
          (CopyMessageTest_ArenaEnabledCopyConstructor_Test *this)

{
  CopyMessageTest_ArenaEnabledCopyConstructor_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__CopyMessageTest_ArenaEnabledCopyConstructor_Test_02a001f0;
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructor) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  Arena arena;
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena, message1);
  TestUtil::ExpectAllFieldsSet(*message2);
}